

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Transform * pbrt::Rotate(Float sinTheta,Float cosTheta,Vector3f *axis)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  Transform *in_RDI;
  float i;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  float in_XMM1_Da;
  Vector3<float> VVar11;
  SquareMatrix<4> m;
  Vector3f a;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  SquareMatrix<4> *in_stack_fffffffffffffe90;
  span<float> local_130;
  span<float> local_120;
  span<float> local_110;
  span<float> local_100;
  span<float> local_f0;
  span<float> local_e0;
  span<float> local_d0;
  span<float> local_c0;
  span<float> local_b0;
  span<float> local_a0;
  span<float> local_90;
  span<float> local_80;
  SquareMatrix<4> local_70;
  undefined8 local_30;
  float local_28;
  undefined8 local_1c;
  float local_14;
  float local_8;
  float local_4;
  
  auVar10 = in_ZMM0._8_56_;
  local_4 = in_ZMM0._0_4_;
  local_8 = in_XMM1_Da;
  VVar11 = Normalize<float>((Vector3<float> *)in_RDI);
  local_28 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  local_30 = vmovlpd_avx(auVar9._0_16_);
  local_1c = local_30;
  local_14 = local_28;
  SquareMatrix<4>::SquareMatrix(&local_70);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)local_1c),
                           ZEXT416((uint)(float)local_1c ^ 0x80000000),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)local_1c),ZEXT416((uint)(float)local_1c),
                           ZEXT416((uint)(auVar1._0_4_ * local_8)));
  i = auVar1._0_4_;
  local_80 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_80,0);
  *pfVar2 = i;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - local_8)),
                           ZEXT416((uint)((float)local_1c * local_1c._4_4_)),
                           ZEXT416((uint)-(local_14 * local_4)));
  fVar3 = auVar1._0_4_;
  local_90 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffe64,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_90,1);
  *pfVar2 = fVar3;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - local_8)),
                           ZEXT416((uint)((float)local_1c * local_14)),
                           ZEXT416((uint)(local_1c._4_4_ * local_4)));
  fVar4 = auVar1._0_4_;
  local_a0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_a0,2);
  *pfVar2 = fVar4;
  local_b0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_b0,3);
  *pfVar2 = 0.0;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - local_8)),
                           ZEXT416((uint)((float)local_1c * local_1c._4_4_)),
                           ZEXT416((uint)(local_14 * local_4)));
  fVar5 = auVar1._0_4_;
  local_c0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_c0,0);
  *pfVar2 = fVar5;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1c._4_4_),ZEXT416((uint)local_1c._4_4_ ^ 0x80000000),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1c._4_4_),ZEXT416((uint)local_1c._4_4_),
                           ZEXT416((uint)(auVar1._0_4_ * local_8)));
  fVar6 = auVar1._0_4_;
  local_d0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_d0,1);
  *pfVar2 = fVar6;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - local_8)),ZEXT416((uint)(local_1c._4_4_ * local_14))
                           ,ZEXT416((uint)-((float)local_1c * local_4)));
  fVar7 = auVar1._0_4_;
  local_e0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_e0,2);
  *pfVar2 = fVar7;
  local_f0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_f0,3);
  *pfVar2 = 0.0;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - local_8)),
                           ZEXT416((uint)((float)local_1c * local_14)),
                           ZEXT416((uint)-(local_1c._4_4_ * local_4)));
  fVar8 = auVar1._0_4_;
  local_100 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_100,0);
  *pfVar2 = fVar8;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - local_8)),ZEXT416((uint)(local_1c._4_4_ * local_14))
                           ,ZEXT416((uint)((float)local_1c * local_4)));
  local_110 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_110,1);
  *pfVar2 = auVar1._0_4_;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_14),ZEXT416((uint)-local_14),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_14),ZEXT416((uint)local_14),
                           ZEXT416((uint)(auVar1._0_4_ * local_8)));
  local_120 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_120,2);
  *pfVar2 = auVar1._0_4_;
  local_130 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar4,fVar3),(int)i);
  pfVar2 = pstd::span<float>::operator[](&local_130,3);
  *pfVar2 = 0.0;
  Transpose<4>(in_stack_fffffffffffffe90);
  Transform::Transform
            ((Transform *)CONCAT44(fVar8,fVar7),(SquareMatrix<4> *)CONCAT44(fVar6,fVar5),
             (SquareMatrix<4> *)CONCAT44(fVar4,fVar3));
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
inline Transform Rotate(Float sinTheta, Float cosTheta, const Vector3f &axis) {
    Vector3f a = Normalize(axis);
    SquareMatrix<4> m;
    // Compute rotation of first basis vector
    m[0][0] = a.x * a.x + (1 - a.x * a.x) * cosTheta;
    m[0][1] = a.x * a.y * (1 - cosTheta) - a.z * sinTheta;
    m[0][2] = a.x * a.z * (1 - cosTheta) + a.y * sinTheta;
    m[0][3] = 0;

    // Compute rotations of second and third basis vectors
    m[1][0] = a.x * a.y * (1 - cosTheta) + a.z * sinTheta;
    m[1][1] = a.y * a.y + (1 - a.y * a.y) * cosTheta;
    m[1][2] = a.y * a.z * (1 - cosTheta) - a.x * sinTheta;
    m[1][3] = 0;

    m[2][0] = a.x * a.z * (1 - cosTheta) - a.y * sinTheta;
    m[2][1] = a.y * a.z * (1 - cosTheta) + a.x * sinTheta;
    m[2][2] = a.z * a.z + (1 - a.z * a.z) * cosTheta;
    m[2][3] = 0;

    return Transform(m, Transpose(m));
}